

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eq_Pos_Table.cpp
# Opt level: O0

void __thiscall Eq_Pos_Table::Eq_Pos_Table(Eq_Pos_Table *this)

{
  initializer_list<Position> __l;
  initializer_list<Position> __l_00;
  initializer_list<Position> __l_01;
  initializer_list<Position> __l_02;
  initializer_list<Position> __l_03;
  int iVar1;
  int iVar2;
  allocator<Position> local_1a1;
  Position local_1a0;
  undefined8 local_194;
  int local_18c;
  iterator local_188;
  size_type local_180;
  vector<Position,_std::allocator<Position>_> local_178;
  allocator<Position> local_159;
  Position local_158;
  undefined8 local_14c;
  int local_144;
  iterator local_140;
  size_type local_138;
  vector<Position,_std::allocator<Position>_> local_130;
  allocator<Position> local_111;
  Position local_110;
  undefined8 local_104;
  int local_fc;
  iterator local_f8;
  size_type local_f0;
  vector<Position,_std::allocator<Position>_> local_e8;
  allocator<Position> local_c9;
  Position local_c8;
  undefined8 local_bc;
  int local_b4;
  iterator local_b0;
  size_type local_a8;
  vector<Position,_std::allocator<Position>_> local_a0;
  allocator<Position> local_81;
  Position local_80;
  undefined8 local_74;
  int local_6c;
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<Position,_std::allocator<Position>_> blue_insert;
  int iStack_2c;
  Position eq2;
  Position eq1;
  int entry;
  int layer;
  Eq_Pos_Table *this_local;
  
  std::
  vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ::vector(&this->blue_eq);
  std::
  vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ::vector(&this->yellow_eq);
  std::
  vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ::vector(&this->red_eq);
  std::
  vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ::vector(&this->green_eq);
  for (eq1.entry = 0; eq1.entry < 4; eq1.entry = eq1.entry + 1) {
    for (eq1.layer = 0; eq1.layer < eq1.entry * 2 + 1; eq1.layer = eq1.layer + 1) {
      switch(eq1.layer) {
      case 0:
        eq2.entry = 3;
        iStack_2c = 3 - eq1.entry;
        break;
      case 1:
        eq2.entry = 3;
        iStack_2c = 4 - eq1.entry;
        break;
      case 2:
        eq2.entry = 2;
        iStack_2c = 4 - eq1.entry;
        break;
      case 3:
        eq2.entry = 2;
        iStack_2c = 5 - eq1.entry;
        break;
      case 4:
        eq2.entry = 1;
        iStack_2c = 5 - eq1.entry;
        break;
      case 5:
        eq2.entry = 1;
        iStack_2c = 6 - eq1.entry;
        break;
      case 6:
        eq2.entry = 0;
        iStack_2c = 6 - eq1.entry;
        break;
      default:
        printf("Invalid position\n");
      }
      iVar1 = eq1.entry * 2 - eq1.layer;
      iVar2 = iStack_2c * 2 - eq1.layer;
      local_80.layer = eq2.entry;
      local_80.reference_corner = R;
      local_74 = CONCAT44(iStack_2c,1);
      local_68 = &local_80;
      local_60 = 2;
      local_80.entry = iVar1;
      local_6c = iVar2;
      std::allocator<Position>::allocator(&local_81);
      __l_03._M_len = local_60;
      __l_03._M_array = local_68;
      std::vector<Position,_std::allocator<Position>_>::vector
                ((vector<Position,_std::allocator<Position>_> *)local_58,__l_03,&local_81);
      std::allocator<Position>::~allocator(&local_81);
      local_c8.layer = eq2.entry;
      local_c8.reference_corner = R;
      local_bc = CONCAT44(iStack_2c,1);
      local_b0 = &local_c8;
      local_a8 = 2;
      local_c8.entry = iVar1;
      local_b4 = iVar2;
      std::allocator<Position>::allocator(&local_c9);
      __l_02._M_len = local_a8;
      __l_02._M_array = local_b0;
      std::vector<Position,_std::allocator<Position>_>::vector(&local_a0,__l_02,&local_c9);
      std::
      vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
      ::push_back(&this->blue_eq,&local_a0);
      std::vector<Position,_std::allocator<Position>_>::~vector(&local_a0);
      std::allocator<Position>::~allocator(&local_c9);
      local_110.layer = eq2.entry;
      local_110.reference_corner = L;
      local_104 = CONCAT44(iStack_2c,3);
      local_f8 = &local_110;
      local_f0 = 2;
      local_110.entry = iVar1;
      local_fc = iVar2;
      std::allocator<Position>::allocator(&local_111);
      __l_01._M_len = local_f0;
      __l_01._M_array = local_f8;
      std::vector<Position,_std::allocator<Position>_>::vector(&local_e8,__l_01,&local_111);
      std::
      vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
      ::push_back(&this->red_eq,&local_e8);
      std::vector<Position,_std::allocator<Position>_>::~vector(&local_e8);
      std::allocator<Position>::~allocator(&local_111);
      local_158.layer = eq2.entry;
      local_158.reference_corner = B;
      local_14c = CONCAT44(iStack_2c,2);
      local_140 = &local_158;
      local_138 = 2;
      local_158.entry = iVar1;
      local_144 = iVar2;
      std::allocator<Position>::allocator(&local_159);
      __l_00._M_len = local_138;
      __l_00._M_array = local_140;
      std::vector<Position,_std::allocator<Position>_>::vector(&local_130,__l_00,&local_159);
      std::
      vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
      ::push_back(&this->yellow_eq,&local_130);
      std::vector<Position,_std::allocator<Position>_>::~vector(&local_130);
      std::allocator<Position>::~allocator(&local_159);
      local_1a0.layer = eq2.entry;
      local_1a0.reference_corner = L;
      local_194 = CONCAT44(iStack_2c,2);
      local_188 = &local_1a0;
      local_180 = 2;
      local_1a0.entry = iVar1;
      local_18c = iVar2;
      std::allocator<Position>::allocator(&local_1a1);
      __l._M_len = local_180;
      __l._M_array = local_188;
      std::vector<Position,_std::allocator<Position>_>::vector(&local_178,__l,&local_1a1);
      std::
      vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
      ::push_back(&this->green_eq,&local_178);
      std::vector<Position,_std::allocator<Position>_>::~vector(&local_178);
      std::allocator<Position>::~allocator(&local_1a1);
      std::vector<Position,_std::allocator<Position>_>::~vector
                ((vector<Position,_std::allocator<Position>_> *)local_58);
    }
  }
  return;
}

Assistant:

Eq_Pos_Table::Eq_Pos_Table(){
    // Build the equivalent position tables
    for(int layer = 0; layer < 4; layer++){
        for(int entry = 0;  entry < (2*layer + 1); entry++){
            //int flat_entry = (layer*layer) + entry;
            Position eq1, eq2;
            switch (entry)
            {
            case 0:
                eq1.layer = 3;
                eq2.layer = 3-layer;
                break;
            case 1:
                eq1.layer = 3;
                eq2.layer = 4-layer;
                break;
            case 2:
                eq1.layer = 2;
                eq2.layer = 4-layer;
                break;
            case 3:
                eq1.layer = 2;
                eq2.layer = 5-layer;
                break;
            case 4:
                eq1.layer = 1;
                eq2.layer = 5-layer;
                break;
            case 5:
                eq1.layer = 1;
                eq2.layer = 6-layer;
                break;
            case 6:
                eq1.layer = 0;
                eq2.layer = 6-layer;
                break;
            default:
                printf("Invalid position\n");
                break;
            }
            eq1.entry = 2*layer  - entry;
            eq2.entry = 2*(eq2.layer)  - entry;

            
            eq1.reference_corner = Corner::R;
            eq2.reference_corner = Corner::L;
            std::vector<Position> blue_insert{eq1, eq2};
            blue_eq.push_back(std::vector<Position>{eq1, eq2});
            eq1.reference_corner = Corner::L;
            eq2.reference_corner = Corner::B;
            red_eq.push_back(std::vector<Position>{eq1, eq2});
            eq1.reference_corner = Corner::B;
            eq2.reference_corner = Corner::R;
            yellow_eq.push_back(std::vector<Position>{eq1, eq2});
            eq1.reference_corner = Corner::L;
            eq2.reference_corner = Corner::R;
            green_eq.push_back(std::vector<Position>{eq1, eq2});
        }
    }
}